

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O2

void test_one<std::vector<long,std::allocator<long>>,default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempt_count,
               default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
               *constructor)

{
  key_type *__k;
  pointer plVar1;
  clock_t cVar2;
  clock_t cVar3;
  ulong uVar4;
  clock_t cVar5;
  iterator iVar6;
  clock_t cVar7;
  ostream *poVar8;
  runtime_error *this;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> set;
  
  cVar2 = clock();
  default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
  ::operator()(&set,constructor,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  cVar3 = clock();
  lVar10 = 0;
  sVar9 = attempt_count;
  while( true ) {
    bVar11 = sVar9 == 0;
    sVar9 = sVar9 - 1;
    if (bVar11) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_422b5);
      poVar8 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_422ce);
      poVar8 = std::ostream::_M_insert<double>
                         (((double)lVar10 /
                          (((double)CONCAT44(0x45300000,(int)(attempt_count >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)attempt_count) - 4503599627370496.0))) /
                          1000000.0);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&set._M_h);
      return;
    }
    uVar4 = random();
    plVar1 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __k = plVar1 + uVar4 % (ulong)((long)(numbers->super__Vector_base<long,_std::allocator<long>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)plVar1 >>
                                  3);
    cVar5 = clock();
    iVar6 = std::
            _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&set._M_h,__k);
    cVar7 = clock();
    if ((iVar6.super__Node_iterator_base<long,_false>._M_cur == (__node_type *)0x0) ||
       (*(long *)((long)iVar6.super__Node_iterator_base<long,_false>._M_cur + 8) != *__k)) break;
    lVar10 = (lVar10 - cVar5) + cVar7;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,anon_var_dwarf_4229c);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_one (const Container & numbers, std::size_t attempt_count, const SetConstructor & constructor)
{
    clock_t creation_time = clock();
    auto set = constructor(numbers.begin(), numbers.end());
    creation_time = clock() - creation_time;

    clock_t search_time = 0;
    for (std::size_t attempt = 0; attempt < attempt_count; ++attempt)
    {
        const auto & element = numbers[static_cast<std::size_t>(random()) % numbers.size()];

        clock_t attempt_time = clock();
        auto search_result = set.find(element);
        attempt_time = clock() - attempt_time;

        if (search_result == set.end() || *search_result != element)
        {
            throw std::runtime_error("Нашлись не все искомые элементы.");
        }

        search_time += attempt_time;
    }

    std::cout << "\tВремя создания: " << static_cast<double>(creation_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время поиска: " << static_cast<double>(search_time) / static_cast<double>(attempt_count) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}